

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

SDL_bool ResetAudioStream(SDL_AudioStream **_stream,SDL_AudioSpec *spec,SDL_AudioSpec *to,
                         SDL_AudioFormat fromfmt,Uint8 fromchannels,int fromfreq)

{
  AudioCallbackWrapperData *pAVar1;
  SDL_AudioStream *pSVar2;
  Uint8 *pUVar3;
  uint uVar4;
  
  if ((((*_stream == (SDL_AudioStream *)0x0) || (spec->channels != fromchannels)) ||
      (spec->format != fromfmt)) || (spec->freq != fromfreq)) {
    (*SDL20_FreeAudioStream)(*_stream);
    pSVar2 = (*SDL20_NewAudioStream)(fromfmt,fromchannels,fromfreq,to->format,to->channels,to->freq)
    ;
    *_stream = pSVar2;
    if (pSVar2 == (SDL_AudioStream *)0x0) {
      return SDL_FALSE;
    }
    spec->channels = fromchannels;
    spec->format = fromfmt;
    spec->freq = fromfreq;
    uVar4 = (fromfmt >> 3 & 0x1f) * (uint)fromchannels * (uint)spec->samples;
    spec->size = uVar4;
    if (audio_cbdata->mixbuflen < (ulong)uVar4) {
      pUVar3 = (Uint8 *)(*SDL20_realloc)(audio_cbdata->mix_buffer,(ulong)uVar4);
      pAVar1 = audio_cbdata;
      if (pUVar3 == (Uint8 *)0x0) {
        (*SDL20_FreeAudioStream)(*_stream);
        *_stream = (SDL_AudioStream *)0x0;
        (*SDL20_Error)(SDL_ENOMEM);
        return SDL_FALSE;
      }
      audio_cbdata->mixbuflen = (ulong)spec->size;
      pAVar1->mix_buffer = pUVar3;
    }
  }
  return SDL_TRUE;
}

Assistant:

static SDL_bool
ResetAudioStream(SDL_AudioStream **_stream, SDL_AudioSpec *spec, const SDL_AudioSpec *to, const SDL_AudioFormat fromfmt, const Uint8 fromchannels, const int fromfreq)
{
    if ((!*_stream) || (spec->channels != fromchannels) || (spec->format != fromfmt) || (spec->freq != fromfreq)) {
        SDL20_FreeAudioStream(*_stream);
        *_stream = SDL20_NewAudioStream(fromfmt, fromchannels, fromfreq, to->format, to->channels, to->freq);
        if (!*_stream) {
            return SDL_FALSE;
        }

        spec->channels = fromchannels;
        spec->format = fromfmt;
        spec->freq = fromfreq;
        spec->size = spec->samples * spec->channels * (SDL_AUDIO_BITSIZE(spec->format) / 8);

        if (audio_cbdata->mixbuflen < spec->size) {
            void *ptr = SDL20_realloc(audio_cbdata->mix_buffer, spec->size);
            if (!ptr) {
                SDL20_FreeAudioStream(*_stream);
                *_stream = NULL;
                SDL20_OutOfMemory();
                return SDL_FALSE;
            }
            audio_cbdata->mixbuflen = spec->size;
            audio_cbdata->mix_buffer = (Uint8 *) ptr;
        }
    }
    return SDL_TRUE;
}